

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

bool __thiscall CLOptions::FillFromFile(CLOptions *this,string *filename)

{
  string *psVar1;
  pointer opt_name;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  long lVar5;
  bool bVar6;
  allocator_type local_2a9;
  CLOptions *local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  ifstream configFile;
  int aiStack_218 [122];
  
  local_2a8 = this;
  std::ifstream::ifstream(&configFile,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(_configFile + -0x18)) == 0) {
    bVar6 = true;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ERROR] File does not exist:\n   \"");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    poVar3 = std::operator<<(poVar3,"\"");
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar6 = *(int *)((long)aiStack_218 + *(long *)(_configFile + -0x18)) == 0;
  }
  std::ifstream::~ifstream(&configFile);
  if (bVar6 != false) {
    std::ifstream::ifstream((istream *)&configFile,(filename->_M_dataplus)._M_p,_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    psVar1 = &local_2a8->configfile_comment;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&configFile,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      if (line._M_string_length != 0) {
        lVar5 = std::__cxx11::string::find((string *)&line,(ulong)psVar1);
        if (lVar5 != 0) {
          CLOptionsHelper::split(&param,&line,' ');
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&values,
                     param.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )param.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_2a9);
          opt_name = param.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_250,&values);
            bVar2 = SetParam(local_2a8,opt_name,&local_250);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_250);
            if (!bVar2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&values);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&param);
              break;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&param);
        }
      }
    }
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&configFile);
  }
  return (bool)(bVar6 ^ 1);
}

Assistant:

bool CLOptions::FillFromFile(const std::string& filename)
{
    // First make sure that the file can actually be opened for reading
    if (!CLOptionsHelper::file_exists(filename)) {
        return true ;
    }
    
    // Open the supplied file
    std::ifstream configFile(filename.c_str()) ;
    std::string line ;
    while (std::getline(configFile, line)) {
        // Skip if the line is empty
        if (line.empty()) continue ;
        // Skip if the line is a comment
        if (line.find(configfile_comment) == 0) continue ;
        
        // Split the line on spaces
        std::vector<std::string> param = CLOptionsHelper::split(line, ' ') ;
        
        // Create a separate string vector that represents the user
        // defined values for this parameter
        std::vector<std::string> values(param.begin()+1, param.end()) ;
        if (values.size() == 0) continue ;
        
        // Now actually set the parameter
        if (!SetParam(param.front(), values)) return false ;
    }
    
    return false ;
}